

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void SplitStringIntoKeyValuePairs
               (string *s,char *kv_split,char *pair_split,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *pairs)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string key;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_90.field_2._M_local_buf[0] = '\0';
  pbVar4 = &local_b8;
  local_98 = pair_split;
  for (uVar3 = 0; uVar3 < s->_M_string_length; uVar3 = uVar3 + 1) {
    cVar1 = (s->_M_dataplus)._M_p[uVar3];
    pbVar2 = &local_90;
    if (cVar1 != *kv_split) {
      if (cVar1 == *local_98) {
        if (local_b8._M_string_length != 0) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_70,&local_b8,&local_90);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)pairs,&local_70);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_70);
        }
        local_b8._M_string_length = 0;
        *local_b8._M_dataplus._M_p = '\0';
        local_90._M_string_length = 0;
        *local_90._M_dataplus._M_p = '\0';
        pbVar2 = &local_b8;
      }
      else {
        std::__cxx11::string::push_back((char)pbVar4);
        pbVar2 = pbVar4;
      }
    }
    pbVar4 = pbVar2;
  }
  if (local_b8._M_string_length != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_70,&local_b8,&local_90);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)pairs,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_70);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

inline void SplitStringIntoKeyValuePairs(
    const std::string& s,
    const char* kv_split,    // For instance: "="
    const char* pair_split,  // For instance: ","
    std::vector< std::pair<std::string, std::string> > *pairs) {
  std::string key, value;
  std::string* add_to = &key;
  for (std::string::size_type i = 0; i < s.length(); ++i) {
    if (s[i] == kv_split[0]) {
      add_to = &value;
    } else if (s[i] == pair_split[0]) {
      if (!key.empty())
        pairs->push_back(std::pair<std::string, std::string>(key, value));
      key.clear();
      value.clear();
      add_to = &key;
    } else {
      *add_to += s[i];
    }
  }
  if (!key.empty())
    pairs->push_back(std::pair<std::string, std::string>(key, value));
}